

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationInvarianceTests.cpp
# Opt level: O1

TestStatus * __thiscall
vkt::tessellation::anon_unknown_0::PrimitiveSetInvariance::InvarianceTestInstance::iterate
          (TestStatus *__return_storage_ptr__,InvarianceTestInstance *this)

{
  string *psVar1;
  undefined8 *puVar2;
  int count;
  iterator __position;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  undefined8 *puVar4;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
  *p_Var5;
  int aiVar6 [2];
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  deInt32 dVar14;
  _Alloc_hider obj;
  pointer pPVar15;
  _Alloc_hider pipelineLayout;
  _Alloc_hider obj_00;
  Allocation *pAVar16;
  deUint32 queueFamilyIndex;
  int iVar17;
  deUint32 stride;
  PerPrimitive *__cur;
  InstanceInterface *vki;
  VkPhysicalDevice physDevice;
  DeviceInterface *vk;
  VkDevice device;
  VkQueue queue;
  Allocator *allocator;
  TextureFormat format;
  DescriptorSetLayoutBuilder *this_00;
  DescriptorPoolBuilder *this_01;
  DescriptorSetUpdateBuilder *this_02;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar18;
  ulong uVar19;
  GraphicsPipelineBuilder *pGVar20;
  const_iterator cVar21;
  ostream *poVar22;
  pointer primitivesA;
  PerPrimitive *pPVar23;
  pointer pPVar24;
  TessPrimitiveType primitiveType;
  TessPrimitiveType TVar25;
  _func_bool_PerPrimitive_ptr_PerPrimitive_ptr *pred;
  vector<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
  *unsorted;
  Vec4 *pVVar26;
  char *pcVar27;
  tessellation *this_03;
  PerPrimitive *primitivesB;
  ulong uVar28;
  _Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
  *this_04;
  _Vector_impl_data *p_Var29;
  int stride_00;
  pointer pTVar30;
  Vec4 *pVVar31;
  long lVar32;
  int i;
  long lVar33;
  int iVar34;
  long lVar35;
  long lVar36;
  long lVar37;
  pointer pPVar38;
  pointer pLVar39;
  long lVar40;
  bool bVar41;
  bool bVar42;
  int local_678;
  Winding *local_670;
  string local_668;
  PerPrimitiveVec prim0;
  PerPrimitiveVec firstPrim;
  char *local_608;
  Deleter<vk::Handle<(vk::HandleType)18>_> DStack_600;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_5e8;
  long local_5e0;
  ulong local_5d8;
  PerPrimitiveVec primitives;
  vector<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase,_std::allocator<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase>_>
  tessLevelCases;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_588;
  pointer pWStack_580;
  pointer local_578;
  VkAllocationCallbacks *pVStack_570;
  pointer local_568;
  pointer local_560;
  VkAllocationCallbacks *local_558;
  pointer local_550;
  int primitiveCount;
  undefined4 uStack_544;
  pointer pWStack_540;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_538;
  VkBuffer local_528;
  pointer pVStack_520;
  pointer local_518;
  pointer local_508;
  ios_base local_4d8 [8];
  ios_base local_4d0 [264];
  VkRenderPass local_3c8;
  Deleter<vk::Handle<(vk::HandleType)17>_> DStack_3c0;
  long *local_3a0;
  long local_398;
  long local_390 [2];
  vector<vkt::tessellation::Winding,_std::allocator<vkt::tessellation::Winding>_> windingCases;
  Deleter<vk::Handle<(vk::HandleType)16>_> DStack_360;
  VkDescriptorSetLayout local_348;
  Deleter<vk::Handle<(vk::HandleType)19>_> DStack_340;
  Buffer resultBuffer;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  primitiveCounts;
  Deleter<vk::Handle<(vk::HandleType)24>_> DStack_2d0;
  VkFramebuffer local_2b8;
  Deleter<vk::Handle<(vk::HandleType)23>_> DStack_2b0;
  VkDescriptorPool local_298;
  Deleter<vk::Handle<(vk::HandleType)21>_> DStack_290;
  string local_278;
  Buffer vertexBuffer;
  key_type local_210;
  string local_1f0;
  VkDescriptorBufferInfo resultBufferInfo;
  ostringstream tessLevelsStr;
  Handle<(vk::HandleType)14> HStack_1b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8 [6];
  ios_base local_148 [8];
  ios_base local_140 [132];
  deUint32 local_bc;
  bool local_b8;
  VkPrimitiveTopology local_b4;
  
  vki = Context::getInstanceInterface((this->super_TestInstance).m_context);
  physDevice = Context::getPhysicalDevice((this->super_TestInstance).m_context);
  requireFeatures(vki,physDevice,0xb);
  vk = Context::getDeviceInterface((this->super_TestInstance).m_context);
  device = Context::getDevice((this->super_TestInstance).m_context);
  queue = Context::getUniversalQueue((this->super_TestInstance).m_context);
  queueFamilyIndex = Context::getUniversalQueueFamilyIndex((this->super_TestInstance).m_context);
  allocator = Context::getDefaultAllocator((this->super_TestInstance).m_context);
  (*(this->super_TestInstance)._vptr_TestInstance[3])(&tessLevelCases,this);
  primitiveCounts.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  primitiveCounts.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  primitiveCounts.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((int)((ulong)((long)tessLevelCases.
                          super__Vector_base<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase,_std::allocator<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)tessLevelCases.
                         super__Vector_base<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase,_std::allocator<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase>_>
                         ._M_impl.super__Vector_impl_data._M_start) >> 5) < 1) {
    iVar34 = 0;
  }
  else {
    lVar37 = 0;
    iVar34 = 0;
    do {
      _primitiveCount = (pointer)0x0;
      pWStack_540 = (pointer)0x0;
      local_538._M_allocated_capacity = 0;
      std::
      vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>
      ::emplace_back<std::vector<int,std::allocator<int>>>
                ((vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>
                  *)&primitiveCounts,(vector<int,_std::allocator<int>_> *)&primitiveCount);
      if ((pointer)_primitiveCount != (pointer)0x0) {
        operator_delete(_primitiveCount,local_538._M_allocated_capacity - (long)_primitiveCount);
      }
      pTVar30 = tessLevelCases.
                super__Vector_base<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase,_std::allocator<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase>_>
                ._M_impl.super__Vector_impl_data._M_start[lVar37].levels.
                super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (0 < (int)((ulong)((long)tessLevelCases.
                                  super__Vector_base<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase,_std::allocator<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase>_>
                                  ._M_impl.super__Vector_impl_data._M_start[lVar37].levels.
                                  super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
                                  ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar30) >> 3)
              * -0x55555555) {
        lVar36 = 8;
        lVar35 = 0;
        do {
          iVar17 = referencePrimitiveCount
                             ((this->m_caseDef).primitiveType,(this->m_caseDef).spacingMode,
                              (this->m_caseDef).usePointMode,
                              (float *)((long)pTVar30->inner + lVar36 + -8),
                              (float *)((long)pTVar30->inner + lVar36));
          primitiveCount = iVar17;
          __position._M_current =
               primitiveCounts.
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish[-1].
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_finish;
          if (__position._M_current ==
              primitiveCounts.
              super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish[-1].
              super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage) {
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      ((vector<int,std::allocator<int>> *)
                       (primitiveCounts.
                        super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish + -1),__position,&primitiveCount)
            ;
          }
          else {
            *__position._M_current = iVar17;
            primitiveCounts.
            super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish[-1].
            super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
                 = __position._M_current + 1;
          }
          iVar17 = primitiveCount;
          if (primitiveCount < iVar34) {
            iVar17 = iVar34;
          }
          iVar34 = iVar17;
          lVar35 = lVar35 + 1;
          pTVar30 = tessLevelCases.
                    super__Vector_base<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase,_std::allocator<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase>_>
                    ._M_impl.super__Vector_impl_data._M_start[lVar37].levels.
                    super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          lVar36 = lVar36 + 0x18;
        } while (lVar35 < (int)((ulong)((long)tessLevelCases.
                                              super__Vector_base<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase,_std::allocator<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase>_>
                                              ._M_impl.super__Vector_impl_data._M_start[lVar37].
                                              levels.
                                              super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)pTVar30) >> 3) * -0x55555555);
      }
      lVar37 = lVar37 + 1;
    } while (lVar37 < (int)((ulong)((long)tessLevelCases.
                                          super__Vector_base<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase,_std::allocator<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)tessLevelCases.
                                         super__Vector_base<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase,_std::allocator<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase>_>
                                         ._M_impl.super__Vector_impl_data._M_start) >> 5));
    iVar34 = iVar34 * 2;
  }
  format = ::vk::mapVkFormat(VK_FORMAT_R32_SFLOAT);
  stride = tcu::getPixelSize(format);
  makeBufferCreateInfo((VkBufferCreateInfo *)&primitiveCount,(ulong)(stride * 0xc),0x80);
  tessellation::Buffer::Buffer
            (&vertexBuffer,vk,device,allocator,(VkBufferCreateInfo *)&primitiveCount,
             (MemoryRequirement)0x1);
  iVar17 = numVerticesPerPrimitive((this->m_caseDef).primitiveType,(this->m_caseDef).usePointMode);
  local_5d8 = (long)(iVar34 * iVar17) << 6 | 0x10;
  makeBufferCreateInfo((VkBufferCreateInfo *)&primitiveCount,local_5d8,0x20);
  tessellation::Buffer::Buffer
            (&resultBuffer,vk,device,allocator,(VkBufferCreateInfo *)&primitiveCount,
             (MemoryRequirement)0x1);
  ::vk::DescriptorSetLayoutBuilder::DescriptorSetLayoutBuilder
            ((DescriptorSetLayoutBuilder *)&primitiveCount);
  this_00 = ::vk::DescriptorSetLayoutBuilder::addBinding
                      ((DescriptorSetLayoutBuilder *)&primitiveCount,
                       VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,1,8,(VkSampler *)0x0);
  ::vk::DescriptorSetLayoutBuilder::build
            ((Move<vk::Handle<(vk::HandleType)19>_> *)&tessLevelsStr,this_00,vk,device,0);
  DStack_340.m_device = (VkDevice)local_1a8[0]._0_8_;
  DStack_340.m_allocator = (VkAllocationCallbacks *)local_1a8[0]._8_8_;
  local_348.m_internal = (deUint64)_tessLevelsStr;
  DStack_340.m_deviceIface = (DeviceInterface *)HStack_1b0.m_internal;
  _tessLevelsStr = (pointer)0x0;
  HStack_1b0.m_internal = 0;
  local_1a8[0]._M_allocated_capacity = (DeviceInterface *)0x0;
  local_1a8[0]._8_8_ = (VkDevice)0x0;
  if (local_518 != (pointer)0x0) {
    operator_delete(local_518,(long)local_508 - (long)local_518);
  }
  if ((VkAllocationCallbacks *)local_538._8_8_ != (VkAllocationCallbacks *)0x0) {
    operator_delete((void *)local_538._8_8_,(long)pVStack_520 - local_538._8_8_);
  }
  if ((pointer)_primitiveCount != (pointer)0x0) {
    operator_delete(_primitiveCount,local_538._M_allocated_capacity - (long)_primitiveCount);
  }
  ::vk::DescriptorPoolBuilder::DescriptorPoolBuilder((DescriptorPoolBuilder *)&tessLevelsStr);
  this_01 = ::vk::DescriptorPoolBuilder::addType
                      ((DescriptorPoolBuilder *)&tessLevelsStr,VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,1);
  ::vk::DescriptorPoolBuilder::build
            ((Move<vk::Handle<(vk::HandleType)21>_> *)&primitiveCount,this_01,vk,device,1,1);
  DStack_290.m_device = (VkDevice)local_538._M_allocated_capacity;
  DStack_290.m_allocator = (VkAllocationCallbacks *)local_538._8_8_;
  local_298.m_internal = (deUint64)_primitiveCount;
  DStack_290.m_deviceIface = (DeviceInterface *)pWStack_540;
  _primitiveCount = (pointer)0x0;
  pWStack_540 = (pointer)0x0;
  local_538._M_allocated_capacity = 0;
  local_538._8_8_ = (VkAllocationCallbacks *)0x0;
  if ((int  [2])_tessLevelsStr != (int  [2])0x0) {
    operator_delete(_tessLevelsStr,local_1a8[0]._M_allocated_capacity - (long)_tessLevelsStr);
  }
  makeDescriptorSet((Move<vk::Handle<(vk::HandleType)22>_> *)&primitiveCount,vk,device,local_298,
                    local_348);
  local_578 = (pointer)local_538._M_allocated_capacity;
  pVStack_570 = (VkAllocationCallbacks *)local_538._8_8_;
  local_588 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_primitiveCount;
  pWStack_580 = pWStack_540;
  resultBufferInfo.buffer.m_internal =
       resultBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal;
  resultBufferInfo.offset = 0;
  resultBufferInfo.range = local_5d8;
  ::vk::DescriptorSetUpdateBuilder::DescriptorSetUpdateBuilder
            ((DescriptorSetUpdateBuilder *)&primitiveCount);
  this_02 = (DescriptorSetUpdateBuilder *)
            ::vk::DescriptorSetUpdateBuilder::write
                      ((DescriptorSetUpdateBuilder *)&primitiveCount,(int)local_588,(void *)0x0,0);
  ::vk::DescriptorSetUpdateBuilder::update(this_02,vk,device);
  if (local_518 != (pointer)0x0) {
    operator_delete(local_518,(long)local_508 - (long)local_518);
  }
  if ((VkAllocationCallbacks *)local_538._8_8_ != (VkAllocationCallbacks *)0x0) {
    operator_delete((void *)local_538._8_8_,(long)pVStack_520 - local_538._8_8_);
  }
  std::
  vector<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
  ::~vector((vector<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
             *)&primitiveCount);
  makeRenderPassWithoutAttachments
            ((Move<vk::Handle<(vk::HandleType)17>_> *)&primitiveCount,vk,device);
  DStack_3c0.m_device = (VkDevice)local_538._M_allocated_capacity;
  DStack_3c0.m_allocator = (VkAllocationCallbacks *)local_538._8_8_;
  local_3c8.m_internal = (deUint64)_primitiveCount;
  DStack_3c0.m_deviceIface = (DeviceInterface *)pWStack_540;
  makeFramebufferWithoutAttachments
            ((Move<vk::Handle<(vk::HandleType)23>_> *)&primitiveCount,vk,device,
             (VkRenderPass)_primitiveCount);
  DStack_2b0.m_device = (VkDevice)local_538._M_allocated_capacity;
  DStack_2b0.m_allocator = (VkAllocationCallbacks *)local_538._8_8_;
  local_2b8.m_internal = (deUint64)_primitiveCount;
  DStack_2b0.m_deviceIface = (DeviceInterface *)pWStack_540;
  makePipelineLayout((Move<vk::Handle<(vk::HandleType)16>_> *)&primitiveCount,vk,device,local_348);
  pipelineLayout._M_p = _primitiveCount;
  DStack_360.m_device = (VkDevice)local_538._M_allocated_capacity;
  DStack_360.m_allocator = (VkAllocationCallbacks *)local_538._8_8_;
  DStack_360.m_deviceIface = (DeviceInterface *)pWStack_540;
  makeCommandPool((Move<vk::Handle<(vk::HandleType)24>_> *)&primitiveCount,vk,device,
                  queueFamilyIndex);
  obj_00._M_p = _primitiveCount;
  DStack_2d0.m_device = (VkDevice)local_538._M_allocated_capacity;
  DStack_2d0.m_allocator = (VkAllocationCallbacks *)local_538._8_8_;
  DStack_2d0.m_deviceIface = (DeviceInterface *)pWStack_540;
  ::vk::allocateCommandBuffer
            ((Move<vk::VkCommandBuffer_s_*> *)&primitiveCount,vk,device,
             (VkCommandPool)_primitiveCount,VK_COMMAND_BUFFER_LEVEL_PRIMARY);
  local_5e8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_primitiveCount;
  local_568 = pWStack_540;
  local_560 = (pointer)local_538._M_allocated_capacity;
  local_558 = (VkAllocationCallbacks *)local_538._8_8_;
  if (0 < (int)((ulong)((long)tessLevelCases.
                              super__Vector_base<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase,_std::allocator<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)tessLevelCases.
                             super__Vector_base<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase,_std::allocator<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 5)) {
    psVar1 = &__return_storage_ptr__->m_description;
    paVar18 = &(__return_storage_ptr__->m_description).field_2;
    local_5e0 = 0;
    do {
      pLVar39 = tessLevelCases.
                super__Vector_base<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase,_std::allocator<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase>_>
                ._M_impl.super__Vector_impl_data._M_start;
      firstPrim.
      super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      firstPrim.
      super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      firstPrim.
      super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      paVar3 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)((this->super_TestInstance).m_context)->m_testCtx->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&tessLevelsStr);
      lVar37 = local_5e0;
      primitiveType = (int)local_5e0 * 0x20;
      pLVar39 = pLVar39 + local_5e0;
      lVar35 = -0x5555555555555555;
      uVar19 = ((long)(pLVar39->levels).
                      super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(pLVar39->levels).
                      super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
      if (0 < (int)uVar19) {
        lVar40 = 0;
        lVar36 = 0;
        do {
          TVar25 = (TessPrimitiveType)lVar35;
          pcVar27 = "";
          if (1 < uVar19) {
            pcVar27 = "\n";
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&tessLevelsStr,pcVar27,(ulong)(1 < uVar19));
          getTessellationLevelsString_abi_cxx11_
                    ((string *)&primitiveCount,
                     (tessellation *)
                     ((long)((pLVar39->levels).
                             super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
                             ._M_impl.super__Vector_impl_data._M_start)->inner + lVar40),
                     (TessLevels *)(ulong)(this->m_caseDef).primitiveType,TVar25);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&tessLevelsStr,_primitiveCount,(long)pWStack_540);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_primitiveCount != &local_538) {
            operator_delete(_primitiveCount,(ulong)(local_538._M_allocated_capacity + 1));
          }
          lVar36 = lVar36 + 1;
          uVar19 = ((long)(pLVar39->levels).
                          super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(pLVar39->levels).
                          super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
          lVar35 = (long)(int)uVar19;
          lVar40 = lVar40 + 0x18;
        } while (lVar36 < lVar35);
      }
      _primitiveCount = (pointer)paVar3;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&pWStack_540);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&pWStack_540,"Tessellation level sets: ",0x19);
      std::__cxx11::stringbuf::str();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&pWStack_540,local_608,(long)DStack_600.m_deviceIface);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)&primitiveCount,(EndMessageToken *)&tcu::TestLog::EndMessage);
      if ((VkDevice *)local_608 != &DStack_600.m_device) {
        operator_delete(local_608,(ulong)(DStack_600.m_device + 1));
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pWStack_540);
      std::ios_base::~ios_base(local_4d0);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&tessLevelsStr);
      std::ios_base::~ios_base(local_148);
      pTVar30 = (pLVar39->levels).
                super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (0 < (int)((ulong)((long)(pLVar39->levels).
                                  super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
                                  ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar30) >> 3)
              * -0x55555555) {
        lVar35 = 0;
        do {
          local_538._M_allocated_capacity = *(undefined8 *)(pTVar30[lVar35].outer + 2);
          _primitiveCount = *(pointer *)pTVar30[lVar35].inner;
          pWStack_540 = *(pointer *)pTVar30[lVar35].outer;
          pVStack_520 = *(pointer *)(pTVar30[lVar35].outer + 2);
          local_538._8_8_ = *(undefined8 *)pTVar30[lVar35].inner;
          local_528.m_internal = *(deUint64 *)pTVar30[lVar35].outer;
          puVar4 = (undefined8 *)
                   (vertexBuffer.m_allocation.
                    super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr
                   )->m_hostPtr;
          puVar4[4] = local_528.m_internal;
          puVar4[5] = pVStack_520;
          puVar4[2] = local_538._M_allocated_capacity;
          puVar4[3] = local_538._8_8_;
          *puVar4 = _primitiveCount;
          puVar4[1] = pWStack_540;
          ::vk::flushMappedMemoryRange
                    (vk,device,
                     (VkDeviceMemory)
                     ((vertexBuffer.m_allocation.
                       super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.
                      ptr)->m_memory).m_internal,
                     (vertexBuffer.m_allocation.
                      super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.
                     ptr)->m_offset,0x30);
          getWindingCases(&windingCases,(this->m_caseDef).windingUsage);
          local_670 = windingCases.
                      super__Vector_base<vkt::tessellation::Winding,_std::allocator<vkt::tessellation::Winding>_>
                      ._M_impl.super__Vector_impl_data._M_start;
          bVar41 = windingCases.
                   super__Vector_base<vkt::tessellation::Winding,_std::allocator<vkt::tessellation::Winding>_>
                   ._M_impl.super__Vector_impl_data._M_start ==
                   windingCases.
                   super__Vector_base<vkt::tessellation::Winding,_std::allocator<vkt::tessellation::Winding>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          if (bVar41) {
            iVar34 = 0;
          }
          else {
            local_550 = pTVar30 + lVar35;
            iVar34 = 0;
            do {
              memset((GraphicsPipelineBuilder *)&tessLevelsStr,0,0xfc);
              local_b8 = false;
              local_b4 = VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST;
              local_bc = 6;
              pGVar20 = GraphicsPipelineBuilder::setVertexInputSingleAttribute
                                  ((GraphicsPipelineBuilder *)&tessLevelsStr,VK_FORMAT_R32_SFLOAT,
                                   stride);
              p_Var5 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
                        *)((this->super_TestInstance).m_context)->m_progCollection;
              primitives.
              super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
              ._M_impl.super__Vector_impl_data._M_start =
                   (pointer)&primitives.
                             super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage;
              std::__cxx11::string::_M_construct<char_const*>((string *)&primitives,"vert","");
              cVar21 = std::
                       _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
                       ::find(p_Var5,(key_type *)&primitives);
              pGVar20 = GraphicsPipelineBuilder::setShader
                                  (pGVar20,vk,device,VK_SHADER_STAGE_VERTEX_BIT,
                                   *(ProgramBinary **)(cVar21._M_node + 2),
                                   (VkSpecializationInfo *)0x0);
              p_Var5 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
                        *)((this->super_TestInstance).m_context)->m_progCollection;
              prim0.
              super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
              ._M_impl.super__Vector_impl_data._M_start =
                   (pointer)&prim0.
                             super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage;
              std::__cxx11::string::_M_construct<char_const*>((string *)&prim0,"tesc","");
              cVar21 = std::
                       _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
                       ::find(p_Var5,(key_type *)&prim0);
              pGVar20 = GraphicsPipelineBuilder::setShader
                                  (pGVar20,vk,device,VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT,
                                   *(ProgramBinary **)(cVar21._M_node + 2),
                                   (VkSpecializationInfo *)0x0);
              p_Var5 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
                        *)((this->super_TestInstance).m_context)->m_progCollection;
              local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_278,"tese","");
              getProgramName(&local_1f0,&local_278,*local_670,(this->m_caseDef).usePointMode);
              cVar21 = std::
                       _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
                       ::find(p_Var5,&local_1f0);
              pGVar20 = GraphicsPipelineBuilder::setShader
                                  (pGVar20,vk,device,VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT,
                                   *(ProgramBinary **)(cVar21._M_node + 2),
                                   (VkSpecializationInfo *)0x0);
              p_Var5 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
                        *)((this->super_TestInstance).m_context)->m_progCollection;
              local_3a0 = local_390;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_3a0,"geom","");
              bVar42 = (this->m_caseDef).usePointMode;
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&primitiveCount);
              poVar22 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&primitiveCount,(char *)local_3a0,local_398);
              bVar42 = bVar42 != false;
              pcVar27 = "";
              if (bVar42) {
                pcVar27 = "_point_mode";
              }
              lVar36 = 0;
              if (bVar42) {
                lVar36 = 0xb;
              }
              std::__ostream_insert<char,std::char_traits<char>>(poVar22,pcVar27,lVar36);
              std::__cxx11::stringbuf::str();
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)&primitiveCount);
              std::ios_base::~ios_base(local_4d8);
              cVar21 = std::
                       _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
                       ::find(p_Var5,&local_210);
              pGVar20 = GraphicsPipelineBuilder::setShader
                                  (pGVar20,vk,device,VK_SHADER_STAGE_GEOMETRY_BIT,
                                   *(ProgramBinary **)(cVar21._M_node + 2),
                                   (VkSpecializationInfo *)0x0);
              GraphicsPipelineBuilder::build
                        ((Move<vk::Handle<(vk::HandleType)18>_> *)&local_668,pGVar20,vk,device,
                         (VkPipelineLayout)pipelineLayout._M_p,local_3c8);
              obj._M_p = local_668._M_dataplus._M_p;
              DStack_600.m_device = (VkDevice)local_668.field_2._M_allocated_capacity;
              DStack_600.m_allocator = (VkAllocationCallbacks *)local_668.field_2._8_8_;
              local_608 = local_668._M_dataplus._M_p;
              DStack_600.m_deviceIface = (DeviceInterface *)local_668._M_string_length;
              local_668._M_dataplus._M_p = (char *)0x0;
              local_668._M_string_length = 0;
              local_668.field_2._M_allocated_capacity = 0;
              local_668.field_2._8_8_ = 0;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_210._M_dataplus._M_p != &local_210.field_2) {
                operator_delete(local_210._M_dataplus._M_p,
                                local_210.field_2._M_allocated_capacity + 1);
              }
              if (local_3a0 != local_390) {
                operator_delete(local_3a0,local_390[0] + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
                operator_delete(local_1f0._M_dataplus._M_p,
                                local_1f0.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_278._M_dataplus._M_p != &local_278.field_2) {
                operator_delete(local_278._M_dataplus._M_p,
                                local_278.field_2._M_allocated_capacity + 1);
              }
              if (prim0.
                  super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                  ._M_impl.super__Vector_impl_data._M_start !=
                  (pointer)&prim0.
                            super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                operator_delete(prim0.
                                super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                                ._M_impl.super__Vector_impl_data._M_start,
                                (ulong)((long)&(prim0.
                                                super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                                                ._M_impl.super__Vector_impl_data._M_end_of_storage)
                                               ->patchPrimitiveID + 1));
              }
              if (primitives.
                  super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                  ._M_impl.super__Vector_impl_data._M_start !=
                  (pointer)&primitives.
                            super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                operator_delete(primitives.
                                super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                                ._M_impl.super__Vector_impl_data._M_start,
                                (ulong)((long)&(primitives.
                                                super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                                                ._M_impl.super__Vector_impl_data._M_end_of_storage)
                                               ->patchPrimitiveID + 1));
              }
              GraphicsPipelineBuilder::~GraphicsPipelineBuilder
                        ((GraphicsPipelineBuilder *)&tessLevelsStr);
              pAVar16 = resultBuffer.m_allocation.
                        super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data
                        .ptr;
              uVar19 = local_5d8;
              memset((resultBuffer.m_allocation.
                      super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.
                     ptr)->m_hostPtr,0,local_5d8);
              ::vk::flushMappedMemoryRange
                        (vk,device,(VkDeviceMemory)(pAVar16->m_memory).m_internal,pAVar16->m_offset,
                         uVar19);
              paVar3 = local_5e8;
              beginCommandBuffer(vk,(VkCommandBuffer)local_5e8->_M_local_buf);
              beginRenderPassWithRasterizationDisabled
                        (vk,(VkCommandBuffer)paVar3->_M_local_buf,local_3c8,local_2b8);
              (*vk->_vptr_DeviceInterface[0x4c])(vk,paVar3,0,obj._M_p);
              (*vk->_vptr_DeviceInterface[0x56])(vk,paVar3,0,pipelineLayout._M_p,0,1,&local_588,0,0)
              ;
              _primitiveCount = (pointer)0x0;
              (*vk->_vptr_DeviceInterface[0x58])(vk,paVar3,0,1,&vertexBuffer,&primitiveCount);
              (*vk->_vptr_DeviceInterface[0x59])(vk,paVar3,0xc,1,0,0);
              endRenderPass(vk,(VkCommandBuffer)paVar3->_M_local_buf);
              makeBufferMemoryBarrier
                        ((VkBufferMemoryBarrier *)&primitiveCount,0x40,0x2000,
                         (VkBuffer)
                         resultBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.
                         object.m_internal,0,local_5d8);
              (*vk->_vptr_DeviceInterface[0x6d])
                        (vk,paVar3,0x8000,0x4000,0,0,0,1,(VkBufferMemoryBarrier *)&primitiveCount,0,
                         0);
              endCommandBuffer(vk,(VkCommandBuffer)paVar3->_M_local_buf);
              submitCommandsAndWait(vk,device,queue,(VkCommandBuffer)paVar3->_M_local_buf);
              pAVar16 = resultBuffer.m_allocation.
                        super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data
                        .ptr;
              uVar19 = local_5d8;
              ::vk::invalidateMappedMemoryRange
                        (vk,device,
                         (VkDeviceMemory)
                         ((resultBuffer.m_allocation.
                           super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
                           m_data.ptr)->m_memory).m_internal,
                         (resultBuffer.m_allocation.
                          super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
                          m_data.ptr)->m_offset,local_5d8);
              stride_00 = (int)uVar19;
              iVar17 = primitiveCounts.
                       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[local_5e0].
                       super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                       ._M_start[lVar35];
              numVerticesPerPrimitive
                        ((this->m_caseDef).primitiveType,(this->m_caseDef).usePointMode);
              count = *pAVar16->m_hostPtr;
              this_03 = (tessellation *)&primitiveCount;
              pred = (_func_bool_PerPrimitive_ptr_PerPrimitive_ptr *)0x10;
              readInterleavedData<vkt::tessellation::(anonymous_namespace)::PerPrimitive>
                        ((vector<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                          *)this_03,count,pAVar16->m_hostPtr,0x10,stride_00);
              sorted<vkt::tessellation::(anonymous_namespace)::PerPrimitive,bool(*)(vkt::tessellation::(anonymous_namespace)::PerPrimitive_const&,vkt::tessellation::(anonymous_namespace)::PerPrimitive_const&)>
                        (&primitives,this_03,unsorted,pred);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)_primitiveCount !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x0) {
                this_03 = (tessellation *)(local_538._M_allocated_capacity - (long)_primitiveCount);
                operator_delete(_primitiveCount,(ulong)this_03);
              }
              pPVar15 = primitives.
                        super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              iVar17 = iVar17 * 2;
              aiVar6 = (int  [2])((this->super_TestInstance).m_context)->m_testCtx->m_log;
              if (count != iVar17) {
                _primitiveCount = (pointer)aiVar6;
                std::__cxx11::ostringstream::ostringstream((ostringstream *)&pWStack_540);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&pWStack_540,"Failure: got ",0xd);
                std::ostream::operator<<((ostringstream *)&pWStack_540,count);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&pWStack_540," primitives, but expected ",0x1a);
                std::ostream::operator<<((ostringstream *)&pWStack_540,iVar17);
                tcu::MessageBuilder::operator<<
                          ((MessageBuilder *)&primitiveCount,
                           (EndMessageToken *)&tcu::TestLog::EndMessage);
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pWStack_540);
                std::ios_base::~ios_base(local_4d0);
                _primitiveCount = (pointer)&local_538;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&primitiveCount,"Invalid set of primitives","");
                __return_storage_ptr__->m_code = QP_TEST_RESULT_FAIL;
                (__return_storage_ptr__->m_description)._M_dataplus._M_p = (pointer)paVar18;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)psVar1,_primitiveCount,
                           (long)&(pWStack_540->imageInfos).
                                  super__Vector_base<vk::VkDescriptorImageInfo,_std::allocator<vk::VkDescriptorImageInfo>_>
                                  ._M_impl.super__Vector_impl_data._M_start + _primitiveCount);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)_primitiveCount != &local_538) {
                  operator_delete(_primitiveCount,(ulong)(local_538._M_allocated_capacity + 1));
                }
joined_r0x0079338c:
                if (primitives.
                    super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                    ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                  operator_delete(primitives.
                                  super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                                  ._M_impl.super__Vector_impl_data._M_start,
                                  (long)primitives.
                                        super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                  (long)primitives.
                                        super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                                        ._M_impl.super__Vector_impl_data._M_start);
                }
                if (obj._M_p != (pointer)0x0) {
                  ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)18>_>::operator()
                            (&DStack_600,(VkPipeline)obj._M_p);
                }
                iVar34 = 1;
                goto LAB_00793574;
              }
              uVar19 = (ulong)((long)primitives.
                                     super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)primitives.
                                     super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 6) >> 1;
              prim0.
              super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              prim0.
              super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              prim0.
              super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              iVar17 = (int)uVar19;
              if ((ulong)(long)iVar17 >> 0x39 != 0) {
                std::__throw_length_error("cannot create std::vector larger than max_size()");
              }
              primitivesA = std::
                            _Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                            ::_M_allocate((_Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                                           *)(long)iVar17,(size_t)this_03);
              lVar36 = uVar19 << 0x20;
              lVar40 = lVar36 >> 0x1a;
              primitivesB = (PerPrimitive *)((long)pPVar15->unused_padding + lVar40 + -8);
              pPVar24 = (pointer)((long)primitivesA->unused_padding + lVar40 + -8);
              pPVar23 = pPVar15;
              pPVar38 = primitivesA;
              if (lVar36 != 0) {
                do {
                  dVar14 = pPVar23->primitiveID;
                  uVar7 = *(undefined8 *)pPVar23->unused_padding;
                  pPVar38->patchPrimitiveID = pPVar23->patchPrimitiveID;
                  pPVar38->primitiveID = dVar14;
                  *(undefined8 *)pPVar38->unused_padding = uVar7;
                  uVar7 = *(undefined8 *)(pPVar23->tessCoord[0].m_data + 2);
                  uVar8 = *(undefined8 *)pPVar23->tessCoord[1].m_data;
                  uVar9 = *(undefined8 *)(pPVar23->tessCoord[1].m_data + 2);
                  uVar10 = *(undefined8 *)pPVar23->tessCoord[2].m_data;
                  uVar11 = *(undefined8 *)(pPVar23->tessCoord[2].m_data + 2);
                  *(undefined8 *)pPVar38->tessCoord[0].m_data =
                       *(undefined8 *)pPVar23->tessCoord[0].m_data;
                  *(undefined8 *)(pPVar38->tessCoord[0].m_data + 2) = uVar7;
                  *(undefined8 *)pPVar38->tessCoord[1].m_data = uVar8;
                  *(undefined8 *)(pPVar38->tessCoord[1].m_data + 2) = uVar9;
                  *(undefined8 *)pPVar38->tessCoord[2].m_data = uVar10;
                  *(undefined8 *)(pPVar38->tessCoord[2].m_data + 2) = uVar11;
                  pPVar23 = pPVar23 + 1;
                  pPVar38 = pPVar38 + 1;
                } while (pPVar23 != primitivesB);
              }
              prim0.
              super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
              ._M_impl.super__Vector_impl_data._M_start = primitivesA;
              prim0.
              super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
              ._M_impl.super__Vector_impl_data._M_finish = pPVar38;
              prim0.
              super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = pPVar24;
              bVar42 = comparePrimitivesExact(primitivesA,primitivesB,iVar17);
              TVar25 = (TessPrimitiveType)pPVar24;
              if (!bVar42) {
                _tessLevelsStr = (pointer)aiVar6;
                std::__cxx11::ostringstream::ostringstream((ostringstream *)&HStack_1b0);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&HStack_1b0,
                           "Failure: tessellation coordinates differ between two primitives drawn in one draw call"
                           ,0x56);
                _primitiveCount =
                     (pointer)tcu::MessageBuilder::operator<<
                                        ((MessageBuilder *)&tessLevelsStr,
                                         (EndMessageToken *)&tcu::TestLog::EndMessage);
                std::__cxx11::ostringstream::ostringstream((ostringstream *)&pWStack_540);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&pWStack_540,
                           "Note: tessellation levels for both primitives were: ",0x34);
                getTessellationLevelsString_abi_cxx11_
                          (&local_668,(tessellation *)local_550,
                           (TessLevels *)(ulong)(this->m_caseDef).primitiveType,TVar25);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&pWStack_540,local_668._M_dataplus._M_p,
                           local_668._M_string_length);
                tcu::MessageBuilder::operator<<
                          ((MessageBuilder *)&primitiveCount,
                           (EndMessageToken *)&tcu::TestLog::EndMessage);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_668._M_dataplus._M_p != &local_668.field_2) {
                  operator_delete(local_668._M_dataplus._M_p,
                                  local_668.field_2._M_allocated_capacity + 1);
                }
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pWStack_540);
                std::ios_base::~ios_base(local_4d0);
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)&HStack_1b0);
                std::ios_base::~ios_base(local_140);
                _primitiveCount = (pointer)&local_538;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&primitiveCount,"Invalid set of primitives","");
                __return_storage_ptr__->m_code = QP_TEST_RESULT_FAIL;
                (__return_storage_ptr__->m_description)._M_dataplus._M_p = (pointer)paVar18;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)psVar1,_primitiveCount,
                           (long)&(pWStack_540->imageInfos).
                                  super__Vector_base<vk::VkDescriptorImageInfo,_std::allocator<vk::VkDescriptorImageInfo>_>
                                  ._M_impl.super__Vector_impl_data._M_start + _primitiveCount);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)_primitiveCount != &local_538) {
                  operator_delete(_primitiveCount,(ulong)(local_538._M_allocated_capacity + 1));
                }
LAB_0079351c:
                if (prim0.
                    super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                    ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                  operator_delete(prim0.
                                  super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                                  ._M_impl.super__Vector_impl_data._M_start,
                                  (long)prim0.
                                        super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                  (long)prim0.
                                        super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                                        ._M_impl.super__Vector_impl_data._M_start);
                }
                goto joined_r0x0079338c;
              }
              local_678 = (int)lVar35;
              if (iVar34 == 0 && local_678 == 0) {
                uVar19 = (long)pPVar38 - (long)primitivesA;
                this_04 = (_Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                           *)((long)uVar19 >> 6);
                if ((ulong)((long)firstPrim.
                                  super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                           (long)firstPrim.
                                 super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                                 ._M_impl.super__Vector_impl_data._M_start) < uVar19) {
                  pPVar24 = std::
                            _Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                            ::_M_allocate(this_04,(size_t)primitivesB);
                  if (primitivesA != pPVar38) {
                    lVar36 = 0;
                    do {
                      puVar2 = (undefined8 *)((long)primitivesA->unused_padding + lVar36 + -8);
                      uVar7 = puVar2[1];
                      puVar4 = (undefined8 *)((long)pPVar24->unused_padding + lVar36 + -8);
                      *puVar4 = *puVar2;
                      puVar4[1] = uVar7;
                      puVar4 = (undefined8 *)((long)primitivesA->tessCoord[0].m_data + lVar36);
                      uVar7 = puVar4[1];
                      puVar2 = (undefined8 *)((long)primitivesA->tessCoord[1].m_data + lVar36);
                      uVar8 = *puVar2;
                      uVar9 = puVar2[1];
                      puVar2 = (undefined8 *)((long)primitivesA->tessCoord[2].m_data + lVar36);
                      uVar10 = *puVar2;
                      uVar11 = puVar2[1];
                      puVar2 = (undefined8 *)((long)pPVar24->tessCoord[0].m_data + lVar36);
                      *puVar2 = *puVar4;
                      puVar2[1] = uVar7;
                      puVar4 = (undefined8 *)((long)pPVar24->tessCoord[1].m_data + lVar36);
                      *puVar4 = uVar8;
                      puVar4[1] = uVar9;
                      puVar4 = (undefined8 *)((long)pPVar24->tessCoord[2].m_data + lVar36);
                      *puVar4 = uVar10;
                      puVar4[1] = uVar11;
                      lVar40 = lVar36 + -8;
                      lVar36 = lVar36 + 0x40;
                    } while ((pointer)((long)primitivesA[1].unused_padding + lVar40) != pPVar38);
                  }
                  if (firstPrim.
                      super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                    operator_delete(firstPrim.
                                    super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                                    ._M_impl.super__Vector_impl_data._M_start,
                                    (long)firstPrim.
                                          super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                    (long)firstPrim.
                                          super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                                          ._M_impl.super__Vector_impl_data._M_start);
                  }
                  firstPrim.
                  super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage =
                       (pointer)((long)pPVar24 + uVar19);
                  firstPrim.
                  super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                  ._M_impl.super__Vector_impl_data._M_start = pPVar24;
                }
                else {
                  uVar28 = (long)firstPrim.
                                 super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)firstPrim.
                                 super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                                 ._M_impl.super__Vector_impl_data._M_start;
                  if (uVar28 < uVar19) {
                    if (0 < (long)uVar28 >> 6) {
                      lVar36 = ((long)uVar28 >> 6) + 1;
                      lVar40 = 0;
                      do {
                        puVar4 = (undefined8 *)((long)primitivesA->unused_padding + lVar40 + -8);
                        uVar7 = *puVar4;
                        uVar8 = puVar4[1];
                        puVar4 = (undefined8 *)((long)primitivesA->tessCoord[0].m_data + lVar40);
                        uVar9 = *puVar4;
                        uVar10 = puVar4[1];
                        puVar4 = (undefined8 *)((long)primitivesA->tessCoord[1].m_data + lVar40);
                        uVar11 = *puVar4;
                        uVar12 = puVar4[1];
                        puVar4 = (undefined8 *)((long)primitivesA->tessCoord[2].m_data + lVar40);
                        uVar13 = puVar4[1];
                        puVar2 = (undefined8 *)
                                 ((long)(firstPrim.
                                         super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->tessCoord[2].
                                        m_data + lVar40);
                        *puVar2 = *puVar4;
                        puVar2[1] = uVar13;
                        puVar4 = (undefined8 *)
                                 ((long)(firstPrim.
                                         super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->tessCoord[1].
                                        m_data + lVar40);
                        *puVar4 = uVar11;
                        puVar4[1] = uVar12;
                        puVar4 = (undefined8 *)
                                 ((long)(firstPrim.
                                         super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->tessCoord[0].
                                        m_data + lVar40);
                        *puVar4 = uVar9;
                        puVar4[1] = uVar10;
                        puVar4 = (undefined8 *)
                                 ((long)(firstPrim.
                                         super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->unused_padding
                                 + lVar40 + -8);
                        *puVar4 = uVar7;
                        puVar4[1] = uVar8;
                        lVar36 = lVar36 + -1;
                        lVar40 = lVar40 + 0x40;
                      } while (1 < lVar36);
                    }
                    pPVar24 = (pointer)(uVar28 + (long)primitivesA);
                    if (pPVar24 != pPVar38) {
                      pVVar26 = (firstPrim.
                                 super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                                 ._M_impl.super__Vector_impl_data._M_finish)->tessCoord;
                      lVar36 = (long)primitivesA + uVar28 + 0x10;
                      do {
                        dVar14 = pPVar24->primitiveID;
                        uVar7 = *(undefined8 *)pPVar24->unused_padding;
                        (firstPrim.
                         super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                         ._M_impl.super__Vector_impl_data._M_finish)->patchPrimitiveID =
                             pPVar24->patchPrimitiveID;
                        (firstPrim.
                         super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                         ._M_impl.super__Vector_impl_data._M_finish)->primitiveID = dVar14;
                        *(undefined8 *)
                         (firstPrim.
                          super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                          ._M_impl.super__Vector_impl_data._M_finish)->unused_padding = uVar7;
                        lVar32 = 0;
                        lVar40 = lVar36;
                        pVVar31 = pVVar26;
                        do {
                          lVar33 = 0;
                          do {
                            pVVar31->m_data[lVar33] = *(float *)(lVar40 + lVar33 * 4);
                            lVar33 = lVar33 + 1;
                          } while (lVar33 != 4);
                          lVar32 = lVar32 + 1;
                          pVVar31 = pVVar31 + 1;
                          lVar40 = lVar40 + 0x10;
                        } while (lVar32 != 3);
                        pPVar24 = pPVar24 + 1;
                        firstPrim.
                        super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                        ._M_impl.super__Vector_impl_data._M_finish =
                             firstPrim.
                             super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                             ._M_impl.super__Vector_impl_data._M_finish + 1;
                        pVVar26 = pVVar26 + 4;
                        lVar36 = lVar36 + 0x40;
                      } while (pPVar24 != pPVar38);
                    }
                  }
                  else if (0 < (long)this_04) {
                    p_Var29 = (_Vector_impl_data *)
                              ((long)&(this_04->_M_impl).super__Vector_impl_data._M_start + 1);
                    lVar36 = 0;
                    do {
                      puVar4 = (undefined8 *)((long)primitivesA->unused_padding + lVar36 + -8);
                      uVar7 = *puVar4;
                      uVar8 = puVar4[1];
                      puVar4 = (undefined8 *)((long)primitivesA->tessCoord[0].m_data + lVar36);
                      uVar9 = *puVar4;
                      uVar10 = puVar4[1];
                      puVar4 = (undefined8 *)((long)primitivesA->tessCoord[1].m_data + lVar36);
                      uVar11 = *puVar4;
                      uVar12 = puVar4[1];
                      puVar4 = (undefined8 *)((long)primitivesA->tessCoord[2].m_data + lVar36);
                      uVar13 = puVar4[1];
                      puVar2 = (undefined8 *)
                               ((long)(firstPrim.
                                       super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->tessCoord[2].
                                      m_data + lVar36);
                      *puVar2 = *puVar4;
                      puVar2[1] = uVar13;
                      puVar4 = (undefined8 *)
                               ((long)(firstPrim.
                                       super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->tessCoord[1].
                                      m_data + lVar36);
                      *puVar4 = uVar11;
                      puVar4[1] = uVar12;
                      puVar4 = (undefined8 *)
                               ((long)(firstPrim.
                                       super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->tessCoord[0].
                                      m_data + lVar36);
                      *puVar4 = uVar9;
                      puVar4[1] = uVar10;
                      puVar4 = (undefined8 *)
                               ((long)(firstPrim.
                                       super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->unused_padding +
                               lVar36 + -8);
                      *puVar4 = uVar7;
                      puVar4[1] = uVar8;
                      p_Var29 = (_Vector_impl_data *)
                                ((long)&p_Var29[0xffffffffffffffff]._M_end_of_storage + 7);
                      lVar36 = lVar36 + 0x40;
                    } while (1 < (long)p_Var29);
                  }
                }
                firstPrim.
                super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                ._M_impl.super__Vector_impl_data._M_finish =
                     (pointer)(uVar19 + (long)firstPrim.
                                              super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                                              ._M_impl.super__Vector_impl_data._M_start);
              }
              else {
                iVar17 = (*(this->super_TestInstance)._vptr_TestInstance[4])
                                   (this,&firstPrim,&prim0,(ulong)(uint)pLVar39->mem);
                if ((char)iVar17 == '\0') {
                  _primitiveCount = (pointer)aiVar6;
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)&pWStack_540);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&pWStack_540,
                             "Note: comparison of tessellation coordinates failed; comparison was made between following cases:\n"
                             ,0x62);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&pWStack_540,"  - case A: program 0, tessellation levels: ",
                             0x2c);
                  TVar25 = primitiveType;
                  getTessellationLevelsString_abi_cxx11_
                            ((string *)&tessLevelsStr,
                             (tessellation *)
                             tessLevelCases.
                             super__Vector_base<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase,_std::allocator<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase>_>
                             ._M_impl.super__Vector_impl_data._M_start[lVar37].levels.
                             super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
                             ._M_impl.super__Vector_impl_data._M_start,
                             (TessLevels *)(ulong)(this->m_caseDef).primitiveType,primitiveType);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&pWStack_540,_tessLevelsStr,HStack_1b0.m_internal);
                  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pWStack_540,"\n",1)
                  ;
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&pWStack_540,"  - case B: program ",0x14);
                  std::ostream::operator<<((ostringstream *)&pWStack_540,iVar34);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&pWStack_540,", tessellation levels: ",0x17);
                  getTessellationLevelsString_abi_cxx11_
                            (&local_668,(tessellation *)local_550,
                             (TessLevels *)(ulong)(this->m_caseDef).primitiveType,TVar25);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&pWStack_540,local_668._M_dataplus._M_p,
                             local_668._M_string_length);
                  tcu::MessageBuilder::operator<<
                            ((MessageBuilder *)&primitiveCount,
                             (EndMessageToken *)&tcu::TestLog::EndMessage);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_668._M_dataplus._M_p != &local_668.field_2) {
                    operator_delete(local_668._M_dataplus._M_p,
                                    local_668.field_2._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)_tessLevelsStr != local_1a8) {
                    operator_delete(_tessLevelsStr,(ulong)(local_1a8[0]._M_allocated_capacity + 1));
                  }
                  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pWStack_540);
                  std::ios_base::~ios_base(local_4d0);
                  _primitiveCount = (pointer)&local_538;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&primitiveCount,"Invalid set of primitives","");
                  __return_storage_ptr__->m_code = QP_TEST_RESULT_FAIL;
                  (__return_storage_ptr__->m_description)._M_dataplus._M_p = (pointer)paVar18;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)psVar1,_primitiveCount,
                             (long)&(pWStack_540->imageInfos).
                                    super__Vector_base<vk::VkDescriptorImageInfo,_std::allocator<vk::VkDescriptorImageInfo>_>
                                    ._M_impl.super__Vector_impl_data._M_start + _primitiveCount);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)_primitiveCount != &local_538) {
                    operator_delete(_primitiveCount,(ulong)(local_538._M_allocated_capacity + 1));
                  }
                  goto LAB_0079351c;
                }
              }
              if (prim0.
                  super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                  ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(prim0.
                                super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                                ._M_impl.super__Vector_impl_data._M_start,
                                (long)prim0.
                                      super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)prim0.
                                      super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
              }
              if (pPVar15 != (pointer)0x0) {
                operator_delete(pPVar15,(long)primitives.
                                              super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                        (long)pPVar15);
              }
              if (obj._M_p != (pointer)0x0) {
                ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)18>_>::operator()
                          (&DStack_600,(VkPipeline)obj._M_p);
              }
              iVar34 = iVar34 + 1;
              local_670 = local_670 + 1;
              bVar41 = local_670 ==
                       windingCases.
                       super__Vector_base<vkt::tessellation::Winding,_std::allocator<vkt::tessellation::Winding>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
            } while (!bVar41);
            iVar34 = 0;
          }
LAB_00793574:
          if (windingCases.
              super__Vector_base<vkt::tessellation::Winding,_std::allocator<vkt::tessellation::Winding>_>
              ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(windingCases.
                            super__Vector_base<vkt::tessellation::Winding,_std::allocator<vkt::tessellation::Winding>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)windingCases.
                                  super__Vector_base<vkt::tessellation::Winding,_std::allocator<vkt::tessellation::Winding>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)windingCases.
                                  super__Vector_base<vkt::tessellation::Winding,_std::allocator<vkt::tessellation::Winding>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
          if (!bVar41) goto LAB_007935c9;
          lVar35 = lVar35 + 1;
          pTVar30 = (pLVar39->levels).
                    super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
                    ._M_impl.super__Vector_impl_data._M_start;
        } while (lVar35 < (int)((ulong)((long)(pLVar39->levels).
                                              super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)pTVar30) >> 3) * -0x55555555);
      }
      iVar34 = 0xe;
LAB_007935c9:
      if (firstPrim.
          super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(firstPrim.
                        super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)firstPrim.
                              super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)firstPrim.
                              super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if ((iVar34 != 0xe) && (iVar34 != 0)) goto LAB_007936a5;
      local_5e0 = local_5e0 + 1;
    } while (local_5e0 <
             (int)((ulong)((long)tessLevelCases.
                                 super__Vector_base<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase,_std::allocator<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)tessLevelCases.
                                super__Vector_base<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase,_std::allocator<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase>_>
                                ._M_impl.super__Vector_impl_data._M_start) >> 5));
  }
  _primitiveCount = (pointer)&local_538;
  std::__cxx11::string::_M_construct<char_const*>((string *)&primitiveCount,"OK","");
  __return_storage_ptr__->m_code = QP_TEST_RESULT_PASS;
  (__return_storage_ptr__->m_description)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->m_description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&__return_storage_ptr__->m_description,_primitiveCount,
             (long)&(pWStack_540->imageInfos).
                    super__Vector_base<vk::VkDescriptorImageInfo,_std::allocator<vk::VkDescriptorImageInfo>_>
                    ._M_impl.super__Vector_impl_data._M_start + _primitiveCount);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_primitiveCount != &local_538) {
    operator_delete(_primitiveCount,(ulong)(local_538._M_allocated_capacity + 1));
  }
LAB_007936a5:
  if (local_5e8 !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    _primitiveCount = (pointer)local_5e8;
    (*(code *)(local_568->imageInfos).
              super__Vector_base<vk::VkDescriptorImageInfo,_std::allocator<vk::VkDescriptorImageInfo>_>
              ._M_impl.super__Vector_impl_data._M_start[0x18].sampler.m_internal)
              (local_568,local_560,local_558,1);
  }
  if (obj_00._M_p != (pointer)0x0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)24>_>::operator()
              (&DStack_2d0,(VkCommandPool)obj_00._M_p);
  }
  if (pipelineLayout._M_p != (pointer)0x0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)16>_>::operator()
              (&DStack_360,(VkPipelineLayout)pipelineLayout._M_p);
  }
  if (local_2b8.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)23>_>::operator()(&DStack_2b0,local_2b8);
  }
  if (local_3c8.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)17>_>::operator()(&DStack_3c0,local_3c8);
  }
  if (local_588 !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    _primitiveCount = (pointer)local_588;
    (*(code *)(pWStack_580->imageInfos).
              super__Vector_base<vk::VkDescriptorImageInfo,_std::allocator<vk::VkDescriptorImageInfo>_>
              ._M_impl.super__Vector_impl_data._M_start[0x14].imageView.m_internal)
              (pWStack_580,local_578,pVStack_570,1);
  }
  if (local_298.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)21>_>::operator()(&DStack_290,local_298);
  }
  if (local_348.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)19>_>::operator()(&DStack_340,local_348);
  }
  if (resultBuffer.m_allocation.
      super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr !=
      (Allocation *)0x0) {
    (*(resultBuffer.m_allocation.
       super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
      _vptr_Allocation[1])();
    resultBuffer.m_allocation.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
    m_data.ptr = (Allocation *)0x0;
  }
  if (resultBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal
      != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
              (&resultBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter,
               (VkBuffer)
               resultBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
               m_internal);
  }
  if (vertexBuffer.m_allocation.
      super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr !=
      (Allocation *)0x0) {
    (*(vertexBuffer.m_allocation.
       super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
      _vptr_Allocation[1])();
    vertexBuffer.m_allocation.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
    m_data.ptr = (Allocation *)0x0;
  }
  if (vertexBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal
      != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
              (&vertexBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter,
               (VkBuffer)
               vertexBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
               m_internal);
  }
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&primitiveCounts);
  std::
  vector<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase,_std::allocator<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase>_>
  ::~vector(&tessLevelCases);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus InvarianceTestInstance::iterate (void)
{
	requireFeatures(m_context.getInstanceInterface(), m_context.getPhysicalDevice(),
					FEATURE_TESSELLATION_SHADER | FEATURE_GEOMETRY_SHADER | FEATURE_VERTEX_PIPELINE_STORES_AND_ATOMICS);

	const DeviceInterface&	vk					= m_context.getDeviceInterface();
	const VkDevice			device				= m_context.getDevice();
	const VkQueue			queue				= m_context.getUniversalQueue();
	const deUint32			queueFamilyIndex	= m_context.getUniversalQueueFamilyIndex();
	Allocator&				allocator			= m_context.getDefaultAllocator();

	const std::vector<LevelCase>	tessLevelCases				= genTessLevelCases();
	const int						numPatchesPerDrawCall		= 2;
	int								maxNumPrimitivesPerPatch	= 0;  // computed below
	std::vector<std::vector<int> >	primitiveCounts;

	for (int caseNdx = 0; caseNdx < static_cast<int>(tessLevelCases.size()); ++caseNdx)
	{
		primitiveCounts.push_back(std::vector<int>());
		for (int levelNdx = 0; levelNdx < static_cast<int>(tessLevelCases[caseNdx].levels.size()); ++levelNdx)
		{
			const int primitiveCount = referencePrimitiveCount(m_caseDef.primitiveType, m_caseDef.spacingMode, m_caseDef.usePointMode,
															   &tessLevelCases[caseNdx].levels[levelNdx].inner[0], &tessLevelCases[caseNdx].levels[levelNdx].outer[0]);
			primitiveCounts.back().push_back(primitiveCount);
			maxNumPrimitivesPerPatch = de::max(maxNumPrimitivesPerPatch, primitiveCount);
		}
	}

	// Vertex input attributes buffer: to pass tessellation levels

	const VkFormat     vertexFormat        = VK_FORMAT_R32_SFLOAT;
	const deUint32     vertexStride        = tcu::getPixelSize(mapVkFormat(vertexFormat));
	const VkDeviceSize vertexDataSizeBytes = NUM_TESS_LEVELS * numPatchesPerDrawCall * vertexStride;
	const Buffer       vertexBuffer        (vk, device, allocator, makeBufferCreateInfo(vertexDataSizeBytes, VK_BUFFER_USAGE_VERTEX_BUFFER_BIT), MemoryRequirement::HostVisible);

	// Output buffer: number of primitives and an array of PerPrimitive structures

	const int		   resultBufferMaxVertices		= numPatchesPerDrawCall * maxNumPrimitivesPerPatch * numVerticesPerPrimitive(m_caseDef.primitiveType, m_caseDef.usePointMode);
	const int		   resultBufferTessCoordsOffset = (int)sizeof(deInt32) * 4;
	const VkDeviceSize resultBufferSizeBytes        = resultBufferTessCoordsOffset + resultBufferMaxVertices * sizeof(PerPrimitive);
	const Buffer       resultBuffer                 (vk, device, allocator, makeBufferCreateInfo(resultBufferSizeBytes, VK_BUFFER_USAGE_STORAGE_BUFFER_BIT), MemoryRequirement::HostVisible);

	// Descriptors

	const Unique<VkDescriptorSetLayout> descriptorSetLayout(DescriptorSetLayoutBuilder()
		.addSingleBinding(VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, VK_SHADER_STAGE_GEOMETRY_BIT)
		.build(vk, device));

	const Unique<VkDescriptorPool> descriptorPool(DescriptorPoolBuilder()
		.addType(VK_DESCRIPTOR_TYPE_STORAGE_BUFFER)
		.build(vk, device, VK_DESCRIPTOR_POOL_CREATE_FREE_DESCRIPTOR_SET_BIT, 1u));

	const Unique<VkDescriptorSet> descriptorSet    (makeDescriptorSet(vk, device, *descriptorPool, *descriptorSetLayout));
	const VkDescriptorBufferInfo  resultBufferInfo = makeDescriptorBufferInfo(resultBuffer.get(), 0ull, resultBufferSizeBytes);

	DescriptorSetUpdateBuilder()
		.writeSingle(*descriptorSet, DescriptorSetUpdateBuilder::Location::binding(0u), VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, &resultBufferInfo)
		.update(vk, device);

	const Unique<VkRenderPass>     renderPass    (makeRenderPassWithoutAttachments (vk, device));
	const Unique<VkFramebuffer>    framebuffer   (makeFramebufferWithoutAttachments(vk, device, *renderPass));
	const Unique<VkPipelineLayout> pipelineLayout(makePipelineLayout               (vk, device, *descriptorSetLayout));
	const Unique<VkCommandPool>    cmdPool       (makeCommandPool                  (vk, device, queueFamilyIndex));
	const Unique<VkCommandBuffer>  cmdBuffer     (allocateCommandBuffer            (vk, device, *cmdPool, VK_COMMAND_BUFFER_LEVEL_PRIMARY));

	for (int tessLevelCaseNdx = 0; tessLevelCaseNdx < static_cast<int>(tessLevelCases.size()); ++tessLevelCaseNdx)
	{
		const LevelCase& levelCase = tessLevelCases[tessLevelCaseNdx];
		PerPrimitiveVec  firstPrim;

		{
			tcu::TestLog& log = m_context.getTestContext().getLog();
			std::ostringstream tessLevelsStr;

			for (int i = 0; i < static_cast<int>(levelCase.levels.size()); ++i)
				tessLevelsStr << (levelCase.levels.size() > 1u ? "\n" : "") << getTessellationLevelsString(levelCase.levels[i], m_caseDef.primitiveType);

			log << tcu::TestLog::Message << "Tessellation level sets: " << tessLevelsStr.str() << tcu::TestLog::EndMessage;
		}

		for (int subTessLevelCaseNdx = 0; subTessLevelCaseNdx < static_cast<int>(levelCase.levels.size()); ++subTessLevelCaseNdx)
		{
			const TessLevels& tessLevels = levelCase.levels[subTessLevelCaseNdx];
			{
				TessLevels data[2];
				data[0] = tessLevels;
				data[1] = tessLevels;

				const Allocation& alloc = vertexBuffer.getAllocation();
				deMemcpy(alloc.getHostPtr(), data, sizeof(data));
				flushMappedMemoryRange(vk, device, alloc.getMemory(), alloc.getOffset(), sizeof(data));
			}

			int programNdx = 0;
			const std::vector<Winding> windingCases = getWindingCases(m_caseDef.windingUsage);
			for (std::vector<Winding>::const_iterator windingIter = windingCases.begin(); windingIter != windingCases.end(); ++windingIter)
			{
				const Unique<VkPipeline> pipeline(GraphicsPipelineBuilder()
					.setPatchControlPoints        (NUM_TESS_LEVELS)
					.setVertexInputSingleAttribute(vertexFormat, vertexStride)
					.setShader                    (vk, device, VK_SHADER_STAGE_VERTEX_BIT,					m_context.getBinaryCollection().get("vert"), DE_NULL)
					.setShader                    (vk, device, VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT,	m_context.getBinaryCollection().get("tesc"), DE_NULL)
					.setShader                    (vk, device, VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT, m_context.getBinaryCollection().get(getProgramName("tese", *windingIter, m_caseDef.usePointMode)), DE_NULL)
					.setShader                    (vk, device, VK_SHADER_STAGE_GEOMETRY_BIT,                m_context.getBinaryCollection().get(getProgramName("geom", m_caseDef.usePointMode)), DE_NULL)
					.build                        (vk, device, *pipelineLayout, *renderPass));

				{
					const Allocation& alloc = resultBuffer.getAllocation();
					deMemset(alloc.getHostPtr(), 0, static_cast<std::size_t>(resultBufferSizeBytes));
					flushMappedMemoryRange(vk, device, alloc.getMemory(), alloc.getOffset(), resultBufferSizeBytes);
				}

				beginCommandBuffer(vk, *cmdBuffer);
				beginRenderPassWithRasterizationDisabled(vk, *cmdBuffer, *renderPass, *framebuffer);

				vk.cmdBindPipeline(*cmdBuffer, VK_PIPELINE_BIND_POINT_GRAPHICS, *pipeline);
				vk.cmdBindDescriptorSets(*cmdBuffer, VK_PIPELINE_BIND_POINT_GRAPHICS, *pipelineLayout, 0u, 1u, &descriptorSet.get(), 0u, DE_NULL);
				{
					const VkDeviceSize vertexBufferOffset = 0ull;
					vk.cmdBindVertexBuffers(*cmdBuffer, 0u, 1u, &vertexBuffer.get(), &vertexBufferOffset);
				}

				vk.cmdDraw(*cmdBuffer, numPatchesPerDrawCall * NUM_TESS_LEVELS, 1u, 0u, 0u);
				endRenderPass(vk, *cmdBuffer);

				{
					const VkBufferMemoryBarrier shaderWriteBarrier = makeBufferMemoryBarrier(
						VK_ACCESS_SHADER_WRITE_BIT, VK_ACCESS_HOST_READ_BIT, *resultBuffer, 0ull, resultBufferSizeBytes);

					vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_ALL_GRAPHICS_BIT, VK_PIPELINE_STAGE_HOST_BIT, 0u,
						0u, DE_NULL, 1u, &shaderWriteBarrier, 0u, DE_NULL);
				}

				endCommandBuffer(vk, *cmdBuffer);
				submitCommandsAndWait(vk, device, queue, *cmdBuffer);

				// Verify case result
				{
					const Allocation& resultAlloc = resultBuffer.getAllocation();
					invalidateMappedMemoryRange(vk, device, resultAlloc.getMemory(), resultAlloc.getOffset(), resultBufferSizeBytes);

					const int				refNumPrimitives     = numPatchesPerDrawCall * primitiveCounts[tessLevelCaseNdx][subTessLevelCaseNdx];
					const int				numPrimitiveVertices = numVerticesPerPrimitive(m_caseDef.primitiveType, m_caseDef.usePointMode);
					const deInt32			numPrimitives        = *static_cast<deInt32*>(resultAlloc.getHostPtr());
					const PerPrimitiveVec	primitives           = sorted(readInterleavedData<PerPrimitive>(numPrimitives, resultAlloc.getHostPtr(), resultBufferTessCoordsOffset, sizeof(PerPrimitive)),
																		  byPatchPrimitiveID);

					// If this fails then we didn't read all vertices from shader and test must be changed to allow more.
					DE_ASSERT(numPrimitiveVertices * numPrimitives <= resultBufferMaxVertices);
					DE_UNREF(numPrimitiveVertices);

					tcu::TestLog& log = m_context.getTestContext().getLog();

					if (numPrimitives != refNumPrimitives)
					{
						log << tcu::TestLog::Message << "Failure: got " << numPrimitives << " primitives, but expected " << refNumPrimitives << tcu::TestLog::EndMessage;

						return tcu::TestStatus::fail("Invalid set of primitives");
					}

					const int					half  = static_cast<int>(primitives.size() / 2);
					const PerPrimitiveVec		prim0 = PerPrimitiveVec(primitives.begin(), primitives.begin() + half);
					const PerPrimitive* const	prim1 = &primitives[half];

					if (!comparePrimitivesExact(&prim0[0], prim1, half))
					{
							log << tcu::TestLog::Message << "Failure: tessellation coordinates differ between two primitives drawn in one draw call" << tcu::TestLog::EndMessage
								<< tcu::TestLog::Message << "Note: tessellation levels for both primitives were: " << getTessellationLevelsString(tessLevels, m_caseDef.primitiveType) << tcu::TestLog::EndMessage;

							return tcu::TestStatus::fail("Invalid set of primitives");
					}

					if (programNdx == 0 && subTessLevelCaseNdx == 0)
						firstPrim = prim0;
					else
					{
						const bool compareOk = compare(firstPrim, prim0, levelCase.mem);
						if (!compareOk)
						{
							log << tcu::TestLog::Message
								<< "Note: comparison of tessellation coordinates failed; comparison was made between following cases:\n"
								<< "  - case A: program 0, tessellation levels: " << getTessellationLevelsString(tessLevelCases[tessLevelCaseNdx].levels[0], m_caseDef.primitiveType) << "\n"
								<< "  - case B: program " << programNdx << ", tessellation levels: " << getTessellationLevelsString(tessLevels, m_caseDef.primitiveType)
								<< tcu::TestLog::EndMessage;

							return tcu::TestStatus::fail("Invalid set of primitives");
						}
					}
				}
				++programNdx;
			}
		}
	}
	return tcu::TestStatus::pass("OK");
}